

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

bool __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::key_is_last_element
          (sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  size_type sVar1;
  pointer pvVar2;
  size_t __n;
  int iVar3;
  
  sVar1 = (this->data_vec_).size_;
  if (sVar1 != 0) {
    pvVar2 = (this->data_vec_).data_ptr_;
    __n = pvVar2[sVar1 - 1].first._M_string_length;
    if (__n == key->_M_string_length) {
      if (__n != 0) {
        iVar3 = bcmp(pvVar2[sVar1 - 1].first._M_dataplus._M_p,(key->_M_dataplus)._M_p,__n);
        return iVar3 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

size_type     size        () const noexcept {   return size_;         }